

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

void __thiscall
AutoArgParse::ArgParser::printAllUsageInfo(ArgParser *this,ostream *os,string *programName)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference this_00;
  reference this_01;
  string *psVar5;
  PrintGroup *pg;
  iterator __end1;
  iterator __begin1;
  deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_> *__range1;
  bool first;
  string *programName_local;
  ostream *os_local;
  ArgParser *this_local;
  
  if ((this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) &&
     ((this->firstTimePrinting & 1U) != 0)) {
    this->firstTimePrinting = false;
    FlagStore::rotateLeft(&(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).store);
  }
  poVar3 = std::operator<<(os,"Usage: ");
  std::operator<<(poVar3,(string *)programName);
  (*(this->super_ComplexFlag<AutoArgParse::DoNothingTrigger>).
    super_Flag<AutoArgParse::DoNothingTrigger>.super_FlagBase.super_ParseToken._vptr_ParseToken[4])
            (this,os);
  std::operator<<(os,"\n\nArguments:\n");
  sVar4 = std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::size
                    (&this->printGroups);
  if (sVar4 == 1) {
    this_00 = std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::at
                        (&this->printGroups,0);
    PrintGroup::printUsageHelp(this_00,os);
  }
  else {
    std::operator<<(os,
                    "The options are divided into the following groups.  Use --help group_name to detail the options under a particular group:\n"
                   );
    bVar1 = true;
    std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::begin
              ((iterator *)&__end1._M_node,&this->printGroups);
    std::deque<AutoArgParse::PrintGroup,_std::allocator<AutoArgParse::PrintGroup>_>::end
              ((iterator *)&pg,&this->printGroups);
    while( true ) {
      bVar2 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&pg);
      if (!bVar2) break;
      this_01 = std::
                _Deque_iterator<AutoArgParse::PrintGroup,_AutoArgParse::PrintGroup_&,_AutoArgParse::PrintGroup_*>
                ::operator*((_Deque_iterator<AutoArgParse::PrintGroup,_AutoArgParse::PrintGroup_&,_AutoArgParse::PrintGroup_*>
                             *)&__end1._M_node);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        psVar5 = PrintGroup::getName_abi_cxx11_(this_01);
        poVar3 = std::operator<<(os,(string *)psVar5);
        poVar3 = std::operator<<(poVar3,"  -- ");
        psVar5 = PrintGroup::getDescription_abi_cxx11_(this_01);
        poVar3 = std::operator<<(poVar3,(string *)psVar5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      std::
      _Deque_iterator<AutoArgParse::PrintGroup,_AutoArgParse::PrintGroup_&,_AutoArgParse::PrintGroup_*>
      ::operator++((_Deque_iterator<AutoArgParse::PrintGroup,_AutoArgParse::PrintGroup_&,_AutoArgParse::PrintGroup_*>
                    *)&__end1._M_node);
    }
    if (this->helpFlag != (ComplexFlag<AutoArgParse::ArgParser::HelpFlagTrigger> *)0x0) {
      std::operator<<(os,"--help prints this message.\n");
    }
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void ArgParser::printAllUsageInfo(
    std::ostream& os, const std::string& programName) {
    if (helpFlag && firstTimePrinting) {
        firstTimePrinting = false;
        // help flag would have been the first thing added, move it to the end.
        store.rotateLeft();
    }
    os << "Usage: " << programName;
    printUsageSummary(os);
    os << "\n\nArguments:\n";
    if (printGroups.size() == 1) {
        printGroups.at(0).printUsageHelp(os);
        return;
    }
    os << "The options are divided into the following groups.  Use --help "
          "group_name to detail the options under a particular group:\n";
    bool first = true;
    for (auto& pg : printGroups) {
        if (first) {
            first = false;
            continue;
        }
        os << pg.getName() << "  -- " << pg.getDescription() << std::endl;
    }
    if (helpFlag) {
        os << "--help prints this message.\n";
    }
}